

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cc
# Opt level: O0

bool __thiscall
google::protobuf::json_internal::JsonWriter::MaybeWriteSpecialFp(JsonWriter *this,double val)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  double local_20;
  double val_local;
  JsonWriter *this_local;
  
  local_20 = val;
  val_local = (double)this;
  dVar3 = std::numeric_limits<double>::infinity();
  dVar1 = local_20;
  if ((val != dVar3) || (NAN(val) || NAN(dVar3))) {
    dVar3 = std::numeric_limits<double>::infinity();
    if ((dVar1 != -dVar3) || (NAN(dVar1) || NAN(-dVar3))) {
      uVar2 = std::isnan(local_20);
      if ((uVar2 & 1) == 0) {
        return false;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"\"NaN\"");
      Write(this,local_50);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"\"-Infinity\"");
      Write(this,local_40);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"\"Infinity\"");
    Write(this,local_30);
  }
  return true;
}

Assistant:

bool JsonWriter::MaybeWriteSpecialFp(double val) {
  if (val == std::numeric_limits<double>::infinity()) {
    Write("\"Infinity\"");
  } else if (val == -std::numeric_limits<double>::infinity()) {
    Write("\"-Infinity\"");
  } else if (std::isnan(val)) {
    Write("\"NaN\"");
  } else {
    return false;
  }
  return true;
}